

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O1

void vkt::BindingModel::anon_unknown_1::ImageFetchRenderInstance::writeDescriptorSetWithTemplate
               (DeviceInterface *vki,VkDevice device,VkDescriptorType descriptorType,
               ShaderInputInterface shaderInterface,VkDescriptorSetLayout layout,
               VkDescriptorPool pool,VkImageView viewA,VkImageView viewB,
               VkDescriptorSet descriptorSet,Move<vk::Handle<(vk::HandleType)32>_> *updateTemplate,
               RawUpdateRegistry *updateRegistry,bool withPush,VkPipelineLayout pipelineLayout)

{
  undefined7 in_stack_00000031;
  VkDescriptorImageInfo imageInfos [2];
  undefined1 local_118 [12];
  VkDescriptorType VStack_10c;
  VkDevice local_108;
  VkAllocationCallbacks *pVStack_100;
  VkDescriptorUpdateTemplateEntryKHR *local_f8;
  iterator iStack_f0;
  VkDescriptorUpdateTemplateEntryKHR *local_e8;
  Move<vk::Handle<(vk::HandleType)32>_> local_d8;
  VkDescriptorUpdateTemplateCreateInfoKHR local_b0;
  VkDescriptorImageInfo local_68;
  VkDescriptorImageInfo local_50;
  
  local_b0.pipelineLayout.m_internal = CONCAT71(in_stack_00000031,withPush);
  local_f8 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  iStack_f0._M_current = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_e8 = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_b0.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR;
  local_b0.pNext = (void *)0x0;
  local_b0.flags = 0;
  local_b0.descriptorUpdateEntryCount = 0;
  local_b0.pDescriptorUpdateEntries = (VkDescriptorUpdateTemplateEntryKHR *)0x0;
  local_b0.templateType = (VkDescriptorUpdateTemplateTypeKHR)(byte)updateRegistry;
  local_b0.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_b0.set = 0;
  local_68.imageLayout =
       (uint)(descriptorType != VK_DESCRIPTOR_TYPE_STORAGE_IMAGE) * 4 + VK_IMAGE_LAYOUT_GENERAL;
  local_68.sampler.m_internal = 0;
  local_50.sampler.m_internal = 0;
  local_50.imageView.m_internal = viewA.m_internal;
  local_b0.descriptorSetLayout.m_internal = layout.m_internal;
  local_68.imageView.m_internal = pool.m_internal;
  local_50.imageLayout = local_68.imageLayout;
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>
            ((RawUpdateRegistry *)updateTemplate,&local_68);
  RawUpdateRegistry::addWriteObject<vk::VkDescriptorImageInfo>
            ((RawUpdateRegistry *)updateTemplate,&local_50);
  if (shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_108 = (VkDevice)
                ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
                m_allocator)->pUserData;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    VStack_10c = descriptorType;
    local_118._8_4_ = 1;
    pVStack_100 = (VkAllocationCallbacks *)0x0;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
      goto LAB_00528601;
    }
  }
  else if (shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    local_108 = (VkDevice)
                ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
                m_allocator)->pUserData;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    VStack_10c = descriptorType;
    local_118._8_4_ = 1;
    pVStack_100 = (VkAllocationCallbacks *)0x0;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
    }
    else {
      (iStack_f0._M_current)->offset = (deUintptr)local_108;
      (iStack_f0._M_current)->stride = 0;
      (iStack_f0._M_current)->dstBinding = 0;
      (iStack_f0._M_current)->dstArrayElement = 0;
      (iStack_f0._M_current)->descriptorCount = 1;
      (iStack_f0._M_current)->descriptorType = descriptorType;
      iStack_f0._M_current = iStack_f0._M_current + 1;
    }
    local_108 = (VkDevice)
                ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
                m_allocator)->pfnAllocation;
    local_118._0_4_ = 1;
    local_118._4_4_ = 0;
    local_118._8_4_ = 1;
    pVStack_100 = (VkAllocationCallbacks *)0x0;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
      goto LAB_00528601;
    }
  }
  else {
    if (shaderInterface != SHADER_INPUT_DESCRIPTOR_ARRAY) goto LAB_00528601;
    local_108 = (VkDevice)
                ((updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.deleter.
                m_allocator)->pUserData;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    VStack_10c = descriptorType;
    local_118._8_4_ = 2;
    pVStack_100 = (VkAllocationCallbacks *)0x18;
    if (iStack_f0._M_current == local_e8) {
      std::
      vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
      ::_M_realloc_insert<vk::VkDescriptorUpdateTemplateEntryKHR_const&>
                ((vector<vk::VkDescriptorUpdateTemplateEntryKHR,std::allocator<vk::VkDescriptorUpdateTemplateEntryKHR>>
                  *)&local_f8,iStack_f0,(VkDescriptorUpdateTemplateEntryKHR *)local_118);
      goto LAB_00528601;
    }
  }
  (iStack_f0._M_current)->offset = (deUintptr)local_108;
  (iStack_f0._M_current)->stride = (deUintptr)pVStack_100;
  (iStack_f0._M_current)->dstBinding = local_118._0_4_;
  (iStack_f0._M_current)->dstArrayElement = local_118._4_4_;
  (iStack_f0._M_current)->descriptorCount = local_118._8_4_;
  (iStack_f0._M_current)->descriptorType = VStack_10c;
  iStack_f0._M_current = iStack_f0._M_current + 1;
LAB_00528601:
  local_b0.pDescriptorUpdateEntries = local_f8;
  local_b0.descriptorUpdateEntryCount =
       (deUint32)((ulong)((long)iStack_f0._M_current - (long)local_f8) >> 5);
  ::vk::createDescriptorUpdateTemplateKHR
            (&local_d8,vki,device,&local_b0,(VkAllocationCallbacks *)0x0);
  local_108 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device;
  pVStack_100 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator;
  local_118._0_8_ = local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal
  ;
  stack0xfffffffffffffef0 =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (*descriptorSet.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)32>_> *)(descriptorSet.m_internal + 8),
               (VkDescriptorUpdateTemplateKHR)*descriptorSet.m_internal);
  }
  *(VkDevice *)(descriptorSet.m_internal + 0x10) = local_108;
  *(VkAllocationCallbacks **)(descriptorSet.m_internal + 0x18) = pVStack_100;
  *(undefined4 *)descriptorSet.m_internal = local_118._0_4_;
  *(undefined4 *)(descriptorSet.m_internal + 4) = local_118._4_4_;
  *(undefined4 *)(descriptorSet.m_internal + 8) = local_118._8_4_;
  *(VkDescriptorType *)(descriptorSet.m_internal + 0xc) = VStack_10c;
  if (local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)32>_>::operator()
              (&local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.deleter,
               (VkDescriptorUpdateTemplateKHR)
               local_d8.super_RefBase<vk::Handle<(vk::HandleType)32>_>.m_data.object.m_internal);
  }
  if ((byte)updateRegistry == 0) {
    (*vki->_vptr_DeviceInterface[0x92])
              (vki,device,viewB.m_internal,*(undefined8 *)descriptorSet.m_internal,
               (updateTemplate->super_RefBase<vk::Handle<(vk::HandleType)32>_>).m_data.object.
               m_internal);
  }
  if (local_f8 != (VkDescriptorUpdateTemplateEntryKHR *)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  return;
}

Assistant:

void ImageFetchRenderInstance::writeDescriptorSetWithTemplate (const vk::DeviceInterface&					vki,
															   vk::VkDevice									device,
															   vk::VkDescriptorType							descriptorType,
															   ShaderInputInterface							shaderInterface,
															   vk::VkDescriptorSetLayout					layout,
															   vk::VkDescriptorPool							pool,
															   vk::VkImageView								viewA,
															   vk::VkImageView								viewB,
															   vk::VkDescriptorSet							descriptorSet,
															   vk::Move<vk::VkDescriptorUpdateTemplateKHR>&	updateTemplate,
															   RawUpdateRegistry&							updateRegistry,
															   bool											withPush,
															   vk::VkPipelineLayout							pipelineLayout)
{
	DE_UNREF(pool);
	std::vector<vk::VkDescriptorUpdateTemplateEntryKHR>		updateEntries;
	vk::VkDescriptorUpdateTemplateCreateInfoKHR				templateCreateInfo	=
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_UPDATE_TEMPLATE_CREATE_INFO_KHR,
		DE_NULL,
		0,
		0,			// updateCount
		DE_NULL,	// pUpdates
		withPush ? vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_PUSH_DESCRIPTORS_KHR : vk::VK_DESCRIPTOR_UPDATE_TEMPLATE_TYPE_DESCRIPTOR_SET_KHR,
		layout,
		vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
		pipelineLayout,
		0
	};
	const vk::VkImageLayout									imageLayout			= getImageLayoutForDescriptorType(descriptorType);
	const vk::VkDescriptorImageInfo							imageInfos[2]		=
	{
		makeDescriptorImageInfo(viewA, imageLayout),
		makeDescriptorImageInfo(viewB, imageLayout),
	};
	updateRegistry.addWriteObject(imageInfos[0]);
	updateRegistry.addWriteObject(imageInfos[1]);

	switch (shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			updateEntries.push_back(createTemplateBinding(0, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(0), 0));
			updateEntries.push_back(createTemplateBinding(1, 0, 1, descriptorType, updateRegistry.getWriteObjectOffset(1), 0));
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			updateEntries.push_back(createTemplateBinding(0, 0, 2, descriptorType, updateRegistry.getWriteObjectOffset(0), sizeof(imageInfos[0])));
			break;

		default:
			DE_FATAL("Impossible");
	}

	templateCreateInfo.pDescriptorUpdateEntries		= &updateEntries[0];
	templateCreateInfo.descriptorUpdateEntryCount	= (deUint32)updateEntries.size();

	updateTemplate									= vk::createDescriptorUpdateTemplateKHR(vki, device, &templateCreateInfo);

	if (!withPush)
	{
		vki.updateDescriptorSetWithTemplateKHR(device, descriptorSet, *updateTemplate, updateRegistry.getRawPointer());
	}
}